

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

Vec_Int_t * Wln_NtkRetime(Wln_Ntk_t *pNtk,int fSkipSimple,int fVerbose)

{
  Vec_Int_t *p;
  int *piVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Wln_Ret_t *p_00;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  size_t __size;
  char *__s;
  int iVar14;
  uint uVar15;
  Vec_Int_t *p_01;
  long lVar16;
  bool bVar17;
  bool bVar18;
  int local_78;
  
  p_00 = Wln_RetAlloc(pNtk);
  p = &p_00->vFront;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0;
  pVVar8->nSize = 0;
  pVVar8->pArray = (int *)0x0;
  Wln_RetPrint(p_00,fVerbose);
  Wln_RetMarkChanges(p_00,(Vec_Int_t *)0x0);
  iVar5 = Wln_RetPropDelay(p_00);
  p_00->DelayMax = iVar5;
  Wln_RetFindSources(p_00);
  uVar15 = p_00->DelayMax;
  printf("Move %4d : Recording initial state     (delay = %6d)\n",0,(ulong)uVar15);
  p_01 = &p_00->vMoves;
  Vec_IntPush(p_01,uVar15);
  Vec_IntPush(p_01,0);
  bVar3 = 0;
  bVar4 = 0;
  iVar12 = 0;
  iVar11 = 0;
  uVar15 = 0;
  local_78 = iVar5;
  do {
    iVar6 = (p_00->vSources).nSize;
    if ((iVar6 == 0) && ((p_00->vSinks).nSize == 0)) break;
    iVar2 = p_00->DelayMax;
    if (iVar6 == 0) {
      bVar17 = false;
    }
    else {
      iVar6 = Wln_RetCheckForward(p_00,&p_00->vSources);
      bVar17 = iVar6 != 0;
    }
    if ((p_00->vSinks).nSize == 0) {
      bVar18 = false;
    }
    else {
      iVar6 = Wln_RetCheckBackward(p_00,&p_00->vSinks);
      bVar18 = iVar6 != 0;
    }
    qsort((p_00->vSources).pArray,(long)(p_00->vSources).nSize,4,Vec_IntSortCompare1);
    qsort((p_00->vSinks).pArray,(long)(p_00->vSinks).nSize,4,Vec_IntSortCompare1);
    if ((bool)(bVar17 | bVar18)) {
      iVar6 = (p_00->vSources).nSize;
      iVar7 = (p_00->vSinks).nSize;
      if (0 < iVar7 && 0 < (long)iVar6) {
        piVar10 = (p_00->vSources).pArray;
        piVar13 = (p_00->vSinks).pArray;
        piVar9 = piVar10 + iVar6;
        piVar1 = piVar13 + iVar7;
        iVar14 = 0;
        do {
          if (*piVar10 == *piVar13) {
            piVar10 = piVar10 + 1;
            piVar13 = piVar13 + 1;
            iVar14 = iVar14 + 1;
          }
          else if (*piVar10 < *piVar13) {
            piVar10 = piVar10 + 1;
          }
          else {
            piVar13 = piVar13 + 1;
          }
        } while ((piVar10 < piVar9) && (piVar13 < piVar1));
        if (iVar14 != 0) {
          __s = "Cannot reduce delay by retiming.";
          goto LAB_00364e54;
        }
      }
      (p_00->vFront).nSize = 0;
      if (((bool)(bVar3 & bVar17)) ||
         ((!(bool)(bVar4 & bVar18) &&
          ((bVar17 == true && bVar18 == false || ((bool)(iVar6 < iVar7 & bVar17 & bVar18))))))) {
        if (0 < iVar6) {
          lVar16 = 0;
          do {
            Vec_IntPush(p,(p_00->vSources).pArray[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (p_00->vSources).nSize);
        }
        if (0 < (p_00->vFront).nSize) {
          lVar16 = 0;
          do {
            Wln_RetMarkChanges_rec(p_00,(p_00->vFront).pArray[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (p_00->vFront).nSize);
        }
        Wln_RetRetimeForward(p_00,p);
        bVar3 = 1;
        iVar6 = 1;
      }
      else {
        if (0 < iVar7) {
          lVar16 = 0;
          do {
            Vec_IntPush(p,(p_00->vSinks).pArray[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (p_00->vSinks).nSize);
        }
        Wln_RetRetimeBackward(p_00,p);
        iVar6 = 0;
        bVar4 = 1;
        if (0 < (p_00->vFront).nSize) {
          lVar16 = 0;
          do {
            Wln_RetMarkChanges_rec(p_00,(p_00->vFront).pArray[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (p_00->vFront).nSize);
        }
      }
      uVar15 = uVar15 + 1;
      iVar7 = Wln_RetPropDelay(p_00);
      if (iVar7 <= local_78) {
        local_78 = iVar7;
      }
      p_00->DelayMax = iVar7;
      if (fVerbose == 0) {
        Wln_RetAddToMoves(p_00,p,iVar7,iVar6,uVar15,fSkipSimple,0);
      }
      else {
        putchar(10);
        Wln_RetAddToMoves(p_00,p,p_00->DelayMax,iVar6,uVar15,fSkipSimple,fVerbose);
        printf("Sinks: ");
        printf("Vector has %d entries: {",(ulong)(uint)(p_00->vSinks).nSize);
        if (0 < (p_00->vSinks).nSize) {
          lVar16 = 0;
          do {
            printf(" %d",(ulong)(uint)(p_00->vSinks).pArray[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (p_00->vSinks).nSize);
        }
        puts(" }");
        printf("Sources: ");
        printf("Vector has %d entries: {",(ulong)(uint)(p_00->vSources).nSize);
        if (0 < (p_00->vSources).nSize) {
          lVar16 = 0;
          do {
            printf(" %d",(ulong)(uint)(p_00->vSources).pArray[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (p_00->vSources).nSize);
        }
        puts(" }");
      }
      bVar17 = 0 < iVar12;
      iVar6 = 0;
      iVar12 = iVar12 + 1;
      if (p_00->DelayMax < iVar2) {
        iVar12 = iVar6;
      }
      iVar11 = iVar11 + (uint)(p_00->DelayMax < iVar2 && bVar17);
      if ((iVar12 < 4) && (iVar11 < 6)) {
        Wln_RetFindSources(p_00);
        iVar2 = (p_00->vEdgeLinks).nSize;
        iVar7 = (p_00->vEdgeLinks).nCap;
        iVar6 = 1;
        if ((iVar7 < iVar2 * 2) && (iVar14 = (int)((long)iVar2 << 2), iVar7 < iVar14)) {
          piVar9 = (p_00->vEdgeLinks).pArray;
          __size = (long)iVar2 << 4;
          if (piVar9 == (int *)0x0) {
            piVar9 = (int *)malloc(__size);
          }
          else {
            piVar9 = (int *)realloc(piVar9,__size);
          }
          (p_00->vEdgeLinks).pArray = piVar9;
          if (piVar9 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p_00->vEdgeLinks).nCap = iVar14;
        }
      }
    }
    else {
      __s = "Cannot retime forward and backward.";
LAB_00364e54:
      puts(__s);
      iVar6 = 0;
    }
  } while ((char)iVar6 != '\0');
  iVar12 = p_01->nSize;
  piVar9 = (p_00->vMoves).pArray;
  pVVar8->nCap = p_01->nCap;
  pVVar8->nSize = iVar12;
  pVVar8->pArray = piVar9;
  p_01->nCap = 0;
  p_01->nSize = 0;
  (p_00->vMoves).pArray = (int *)0x0;
  Wln_RetFree(p_00);
  if (fVerbose == 0) {
    printf("Retiming instruction contains %d moves and %d total retimed objects.\n",(ulong)uVar15,
           (ulong)((pVVar8->nSize + uVar15 * -2) - 2));
    printf("Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n",
           SUB84(((double)(iVar5 - local_78) * 100.0) / (double)iVar5,0));
  }
  else {
    puts("\nThe resulting moves recorded in terms of name IDs of the NDR nodes:");
    uVar15 = pVVar8->nSize;
    printf("Vector has %d entries: {",(ulong)uVar15);
    if (0 < (long)(int)uVar15) {
      piVar9 = pVVar8->pArray;
      lVar16 = 0;
      do {
        printf(" %d",(ulong)(uint)piVar9[lVar16]);
        lVar16 = lVar16 + 1;
      } while ((int)uVar15 != lVar16);
    }
    puts(" }");
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Wln_NtkRetime( Wln_Ntk_t * pNtk, int fSkipSimple, int fVerbose )
{
    Wln_Ret_t * p = Wln_RetAlloc( pNtk );
    Vec_Int_t * vSources = &p->vSources;
    Vec_Int_t * vSinks   = &p->vSinks;
    Vec_Int_t * vFront   = &p->vFront;
    Vec_Int_t * vMoves   = Vec_IntAlloc(0);
    int nMoves = 0, fPrevFwd = 0, fPrevBwd = 0, nCountIncrease = 0;
    int DelayInit = 0, DelayBest = 0, nChange = 0;
    Wln_RetPrint( p, fVerbose );
    Wln_RetMarkChanges( p, NULL );
    p->DelayMax = DelayInit = DelayBest = Wln_RetPropDelay( p );
    Wln_RetFindSources( p );
    Wln_RetAddToMoves( p, NULL, p->DelayMax, 0, nMoves, fSkipSimple, fVerbose );
    while ( Vec_IntSize(vSources) || Vec_IntSize(vSinks) )
    {
        int DelayMaxPrev = p->DelayMax;
        int fForward  = Vec_IntSize(vSources) && Wln_RetCheckForward( p, vSources );
        int fBackward = Vec_IntSize(vSinks)   && Wln_RetCheckBackward( p, vSinks );
        Vec_IntSort( vSources, 0 );
        Vec_IntSort( vSinks, 0 );

        if ( !fForward && !fBackward )
        {
            printf( "Cannot retime forward and backward.\n" );
            break;
        }
        if ( Vec_IntTwoCountCommon(vSources, vSinks) )
        {
            printf( "Cannot reduce delay by retiming.\n" );
            break;
        }
        nMoves++;
        Vec_IntClear( vFront );
        if ( (fPrevFwd && fForward) || (!(fPrevBwd && fBackward) && ((fForward && !fBackward) || (fForward && fBackward && Vec_IntSize(vSources) < Vec_IntSize(vSinks)))) )
        {
            Vec_IntAppend( vFront, vSources );
            Wln_RetMarkChanges( p, vFront );
            Wln_RetRetimeForward( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 1, fBackward = 0;
            fPrevFwd = 1;
        }
        else
        {
            Vec_IntAppend( vFront, vSinks );
            Wln_RetRetimeBackward( p, vFront );
            Wln_RetMarkChanges( p, vFront );
            p->DelayMax = Wln_RetPropDelay( p );
            fForward = 0, fBackward = 1;
            fPrevBwd = 1;
        }
        DelayBest = Abc_MinInt( DelayBest, p->DelayMax );
        //Wln_RetPrint( p );
        if ( fVerbose )
            printf( "\n" );
        Wln_RetAddToMoves( p, vFront, p->DelayMax, fForward, nMoves, fSkipSimple, fVerbose );
        if ( fVerbose )
        {
            printf( "Sinks: " );
            Vec_IntPrint( &p->vSinks );
            printf( "Sources: " );
            Vec_IntPrint( &p->vSources );
        }
        if ( p->DelayMax >= DelayMaxPrev )
            nCountIncrease++;
        else
        {
            if ( nCountIncrease > 0 )
                nChange++;
            nCountIncrease = 0;
        }
        if ( nCountIncrease > 3 )
            break;
        if ( nChange > 5 )
            break;
        Wln_RetFindSources( p );
        if ( 2*Vec_IntSize(&p->vEdgeLinks) > Vec_IntCap(&p->vEdgeLinks) )
            Vec_IntGrow( &p->vEdgeLinks, 4*Vec_IntSize(&p->vEdgeLinks) );
    }
    ABC_SWAP( Vec_Int_t, *vMoves, p->vMoves );
    Wln_RetFree( p );
    if ( fVerbose )
    {
        printf( "\nThe resulting moves recorded in terms of name IDs of the NDR nodes:\n" );
        Vec_IntPrint( vMoves );
    }
    else
    {
        printf( "Retiming instruction contains %d moves and %d total retimed objects.\n", nMoves, Vec_IntSize(vMoves)-2*nMoves-2 );
        printf( "Initial delay = %d.  The best delay achieved = %d.  Improvement = %d. (%6.2f %%)\n", 
            DelayInit, DelayBest, DelayInit - DelayBest, 100.0 * (DelayInit - DelayBest) / DelayInit );
    }
    return vMoves;
}